

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O2

void t3strlwr(char *p)

{
  wchar_t wVar1;
  
  for (; *p != '\0'; p = p + 1) {
    wVar1 = to_lower((int)*p);
    *p = (char)wVar1;
  }
  return;
}

Assistant:

void t3strlwr(char *p)
{
    for ( ; *p != '\0' ; ++p)
        *p = (char)to_lower(*p);
}